

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O3

void testing::internal::XmlUnitTestResultPrinter::PrintXmlUnitTest
               (ostream *stream,UnitTest *unit_test)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  TestSuite *test_suite;
  pointer ppTVar3;
  bool bVar4;
  pointer ppTVar5;
  pointer ppTVar6;
  ostream *poVar7;
  int iVar8;
  TimeInMillis ms;
  TimeInMillis ms_00;
  TestResult *extraout_RDX;
  TestResult *extraout_RDX_00;
  TestResult *extraout_RDX_01;
  TestResult *extraout_RDX_02;
  TestResult *extraout_RDX_03;
  TestResult *extraout_RDX_04;
  TestResult *result;
  UnitTestImpl *pUVar9;
  uint uVar10;
  long lVar11;
  undefined1 local_98 [8];
  string kTestsuites;
  string local_70;
  string local_50;
  
  local_98 = (undefined1  [8])&kTestsuites._M_string_length;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_98,"testsuites","");
  std::__ostream_insert<char,std::char_traits<char>>
            (stream,"<?xml version=\"1.0\" encoding=\"UTF-8\"?>\n",0x27);
  std::__ostream_insert<char,std::char_traits<char>>(stream,"<",1);
  std::__ostream_insert<char,std::char_traits<char>>
            (stream,(char *)local_98,(long)kTestsuites._M_dataplus._M_p);
  paVar1 = &local_50.field_2;
  local_50._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"tests","");
  kTestsuites.field_2._12_4_ = UnitTestImpl::reportable_test_count(unit_test->impl_);
  StreamableToString<int>(&local_70,(int *)(kTestsuites.field_2._M_local_buf + 0xc));
  OutputXmlAttribute(stream,(string *)local_98,&local_50,&local_70);
  paVar2 = &local_70.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar1) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  local_50._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"failures","");
  kTestsuites.field_2._12_4_ = UnitTestImpl::failed_test_count(unit_test->impl_);
  StreamableToString<int>(&local_70,(int *)(kTestsuites.field_2._M_local_buf + 0xc));
  OutputXmlAttribute(stream,(string *)local_98,&local_50,&local_70);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar1) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  local_50._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"disabled","");
  kTestsuites.field_2._12_4_ = UnitTestImpl::reportable_disabled_test_count(unit_test->impl_);
  StreamableToString<int>(&local_70,(int *)(kTestsuites.field_2._M_local_buf + 0xc));
  OutputXmlAttribute(stream,(string *)local_98,&local_50,&local_70);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar1) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  local_50._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"errors","");
  local_70._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"0","");
  OutputXmlAttribute(stream,(string *)local_98,&local_50,&local_70);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar1) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  local_50._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"time","");
  FormatTimeInMillisAsSeconds_abi_cxx11_(&local_70,(internal *)unit_test->impl_->elapsed_time_,ms);
  OutputXmlAttribute(stream,(string *)local_98,&local_50,&local_70);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar1) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  local_50._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"timestamp","");
  FormatEpochTimeInMillisAsIso8601_abi_cxx11_
            (&local_70,(internal *)unit_test->impl_->start_timestamp_,ms_00);
  OutputXmlAttribute(stream,(string *)local_98,&local_50,&local_70);
  result = extraout_RDX;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    result = extraout_RDX_00;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar1) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    result = extraout_RDX_01;
  }
  if (FLAGS_gtest_shuffle == '\x01') {
    local_50._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"random_seed","");
    kTestsuites.field_2._12_4_ = unit_test->impl_->random_seed_;
    StreamableToString<int>(&local_70,(int *)(kTestsuites.field_2._M_local_buf + 0xc));
    OutputXmlAttribute(stream,(string *)local_98,&local_50,&local_70);
    result = extraout_RDX_02;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != paVar2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
      result = extraout_RDX_03;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != paVar1) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      result = extraout_RDX_04;
    }
  }
  TestPropertiesAsXmlAttributes_abi_cxx11_
            (&local_50,(XmlUnitTestResultPrinter *)&unit_test->impl_->ad_hoc_test_result_,result);
  std::__ostream_insert<char,std::char_traits<char>>
            (stream,local_50._M_dataplus._M_p,local_50._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar1) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  local_50._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"name","");
  local_70._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"AllTests","");
  OutputXmlAttribute(stream,(string *)local_98,&local_50,&local_70);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar1) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  std::__ostream_insert<char,std::char_traits<char>>(stream,">\n",2);
  pUVar9 = unit_test->impl_;
  ppTVar5 = (pUVar9->test_suites_).
            super__Vector_base<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (0 < (int)((ulong)((long)(pUVar9->test_suites_).
                              super__Vector_base<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)ppTVar5) >> 3)) {
    lVar11 = 0;
    do {
      test_suite = ppTVar5[lVar11];
      ppTVar6 = (test_suite->test_info_list_).
                super__Vector_base<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
      ppTVar3 = (test_suite->test_info_list_).
                super__Vector_base<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
      if (ppTVar6 != ppTVar3) {
        iVar8 = 0;
        do {
          uVar10 = (*ppTVar6)->is_in_another_shard_ ^ 1;
          if ((*ppTVar6)->matches_filter_ == false) {
            uVar10 = 0;
          }
          iVar8 = iVar8 + uVar10;
          ppTVar6 = ppTVar6 + 1;
        } while (ppTVar6 != ppTVar3);
        if (iVar8 != 0) {
          PrintXmlTestSuite(stream,test_suite);
          pUVar9 = unit_test->impl_;
        }
      }
      lVar11 = lVar11 + 1;
      ppTVar5 = (pUVar9->test_suites_).
                super__Vector_base<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
    } while (lVar11 < (int)((ulong)((long)(pUVar9->test_suites_).
                                          super__Vector_base<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>
                                          ._M_impl.super__Vector_impl_data._M_finish - (long)ppTVar5
                                   ) >> 3));
  }
  bVar4 = TestResult::Failed(&pUVar9->ad_hoc_test_result_);
  if (bVar4) {
    OutputXmlTestSuiteForTestResult(stream,&unit_test->impl_->ad_hoc_test_result_);
  }
  std::__ostream_insert<char,std::char_traits<char>>(stream,"</",2);
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     (stream,(char *)local_98,(long)kTestsuites._M_dataplus._M_p);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,">\n",2);
  if (local_98 != (undefined1  [8])&kTestsuites._M_string_length) {
    operator_delete((void *)local_98,kTestsuites._M_string_length + 1);
  }
  return;
}

Assistant:

void XmlUnitTestResultPrinter::PrintXmlUnitTest(std::ostream* stream,
                                                const UnitTest& unit_test) {
  const std::string kTestsuites = "testsuites";

  *stream << "<?xml version=\"1.0\" encoding=\"UTF-8\"?>\n";
  *stream << "<" << kTestsuites;

  OutputXmlAttribute(stream, kTestsuites, "tests",
                     StreamableToString(unit_test.reportable_test_count()));
  OutputXmlAttribute(stream, kTestsuites, "failures",
                     StreamableToString(unit_test.failed_test_count()));
  OutputXmlAttribute(
      stream, kTestsuites, "disabled",
      StreamableToString(unit_test.reportable_disabled_test_count()));
  OutputXmlAttribute(stream, kTestsuites, "errors", "0");
  OutputXmlAttribute(stream, kTestsuites, "time",
                     FormatTimeInMillisAsSeconds(unit_test.elapsed_time()));
  OutputXmlAttribute(
      stream, kTestsuites, "timestamp",
      FormatEpochTimeInMillisAsIso8601(unit_test.start_timestamp()));

  if (GTEST_FLAG_GET(shuffle)) {
    OutputXmlAttribute(stream, kTestsuites, "random_seed",
                       StreamableToString(unit_test.random_seed()));
  }
  *stream << TestPropertiesAsXmlAttributes(unit_test.ad_hoc_test_result());

  OutputXmlAttribute(stream, kTestsuites, "name", "AllTests");
  *stream << ">\n";

  for (int i = 0; i < unit_test.total_test_suite_count(); ++i) {
    if (unit_test.GetTestSuite(i)->reportable_test_count() > 0)
      PrintXmlTestSuite(stream, *unit_test.GetTestSuite(i));
  }

  // If there was a test failure outside of one of the test suites (like in a
  // test environment) include that in the output.
  if (unit_test.ad_hoc_test_result().Failed()) {
    OutputXmlTestSuiteForTestResult(stream, unit_test.ad_hoc_test_result());
  }

  *stream << "</" << kTestsuites << ">\n";
}